

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O2

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  uint8 uVar1;
  byte bVar2;
  hmm_context_t *phVar3;
  int32 *piVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  int iVar8;
  int32 iVar9;
  uint uVar10;
  ulong uVar11;
  uint16 uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  
  phVar3 = hmm->ctx;
  uVar1 = hmm->mpx;
  uVar7 = hmm->senid[0];
  if (uVar1 == '\0') {
    if (uVar7 == 0xffff) {
      iVar8 = -0x20000000;
      goto LAB_00129f12;
    }
  }
  else {
    iVar8 = -0x20000000;
    if ((uVar7 == 0xffff) || (uVar7 = *phVar3->sseq[uVar7], uVar7 == 0xffff)) goto LAB_00129f12;
  }
  iVar8 = -(int)phVar3->senscore[uVar7];
LAB_00129f12:
  piVar4 = phVar3->st_sen_scr;
  *piVar4 = iVar8 + hmm->score[0];
  uVar11 = 0;
  while( true ) {
    bVar2 = hmm->n_emit_state;
    if ((ulong)bVar2 <= uVar11 + 1) break;
    uVar12 = hmm->senid[uVar11 + 1];
    if (uVar1 == '\0') {
      if (uVar12 != 0xffff) goto LAB_00129f75;
      iVar8 = -0x20000000;
    }
    else {
      iVar8 = -0x20000000;
      if ((uVar12 != 0xffff) && (uVar12 = phVar3->sseq[uVar12][uVar11 + 1], uVar12 != 0xffff)) {
LAB_00129f75:
        iVar8 = -(int)phVar3->senscore[uVar12];
      }
    }
    iVar9 = iVar8 + hmm->score[uVar11 + 1];
    if (iVar9 < -0x1fffffff) {
      iVar9 = -0x20000000;
    }
    piVar4[uVar11 + 1] = iVar9;
    uVar11 = uVar11 + 1;
  }
  iVar8 = -0x20000000;
  uVar11 = 0xffffffff;
  uVar10 = bVar2 - 1;
  for (uVar13 = uVar10; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
    if ((phVar3->tp[hmm->tmatid][uVar13][(uint)bVar2] != 0xff) &&
       (iVar5 = piVar4[uVar13] - (uint)phVar3->tp[hmm->tmatid][uVar13][(uint)bVar2], iVar8 < iVar5))
    {
      uVar11 = (ulong)uVar13;
      iVar8 = iVar5;
    }
  }
  hmm->out_score = iVar8;
  if (-1 < (int)uVar11) {
    hmm->out_history = hmm->history[uVar11];
  }
  do {
    if ((int)uVar10 < 0) {
      hmm->bestscore = iVar8;
      return iVar8;
    }
    uVar11 = (ulong)uVar10;
    uVar13 = (uint)phVar3->tp[hmm->tmatid][uVar11][uVar11];
    if (uVar13 == 0xff) {
      iVar5 = -0x20000000;
    }
    else {
      iVar5 = piVar4[uVar11] - uVar13;
    }
    uVar6 = 0xffffffff;
    uVar14 = uVar11;
    while (0 < (int)uVar14) {
      uVar14 = uVar14 - 1;
      uVar13 = (uint)phVar3->tp[hmm->tmatid][uVar14 & 0xffffffff][uVar11];
      if ((uVar13 != 0xff) && (iVar15 = piVar4[uVar14 & 0xffffffff] - uVar13, iVar5 < iVar15)) {
        uVar6 = uVar14 & 0xffffffff;
        iVar5 = iVar15;
      }
    }
    if (uVar11 == 0) {
      hmm->score[0] = iVar5;
      if (-1 < (int)uVar6) {
        hmm->history[0] = hmm->history[uVar6];
        goto LAB_0012a0a7;
      }
    }
    else {
      hmm->score[uVar11] = iVar5;
      if (-1 < (int)uVar6) {
        hmm->history[uVar11] = hmm->history[uVar6];
LAB_0012a0a7:
        if (uVar1 != '\0') {
          hmm->senid[uVar11] = hmm->senid[uVar6];
        }
      }
    }
    if (iVar8 <= iVar5) {
      iVar8 = iVar5;
    }
    uVar10 = uVar10 - 1;
  } while( true );
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) WORSE_THAN WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) BETTER_THAN TMAT_WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        /* Propagate ssid for multiplex HMMs */
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->senid[to] = hmm->senid[bestfrom];

        if (bestscr WORSE_THAN scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}